

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * roaring::Roaring64Map::readSafe(char *buf,size_t maxbytes)

{
  ulong uVar1;
  runtime_error *prVar2;
  ulong in_RDX;
  ulong *in_RSI;
  Roaring64Map *in_RDI;
  size_t tz;
  Roaring read_var;
  uint32_t key;
  uint64_t lcv;
  uint64_t map_size;
  Roaring64Map *result;
  Roaring64Map *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  Roaring64Map *this;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  ulong local_38;
  ulong local_18;
  
  if (in_RDX < 8) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"ran out of bytes");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = in_RDI;
  Roaring64Map(in_stack_ffffffffffffff70);
  uVar1 = *in_RSI;
  local_18 = in_RDX - 8;
  local_38 = 0;
  while( true ) {
    if (uVar1 <= local_38) {
      return this;
    }
    if (local_18 < 4) break;
    Roaring::readSafe(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 =
         Roaring::getSizeInBytes((Roaring *)this,SUB81((ulong)in_RDI >> 0x38,0));
    local_18 = (local_18 - 4) - in_stack_ffffffffffffff90;
    emplaceOrInsert(in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                    (Roaring *)in_stack_ffffffffffffff70);
    Roaring::~Roaring((Roaring *)in_stack_ffffffffffffff70);
    local_38 = local_38 + 1;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"ran out of bytes");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Roaring64Map readSafe(const char *buf, size_t maxbytes) {
        if (maxbytes < sizeof(uint64_t)) {
            ROARING_TERMINATE("ran out of bytes");
        }
        Roaring64Map result;
        uint64_t map_size;
        std::memcpy(&map_size, buf, sizeof(uint64_t));
        buf += sizeof(uint64_t);
        maxbytes -= sizeof(uint64_t);
        for (uint64_t lcv = 0; lcv < map_size; lcv++) {
            if (maxbytes < sizeof(uint32_t)) {
                ROARING_TERMINATE("ran out of bytes");
            }
            uint32_t key;
            std::memcpy(&key, buf, sizeof(uint32_t));
            // ^-- Note: `uint32_t key = *((uint32_t*)buf);` is undefined

            buf += sizeof(uint32_t);
            maxbytes -= sizeof(uint32_t);
            // read map value Roaring
            Roaring read_var = Roaring::readSafe(buf, maxbytes);
            // forward buffer past the last Roaring Bitmap
            size_t tz = read_var.getSizeInBytes(true);
            buf += tz;
            maxbytes -= tz;
            result.emplaceOrInsert(key, std::move(read_var));
        }
        return result;
    }